

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTSnapObjects.cpp
# Opt level: O1

void TTD::NSSnapObjects::AssertSnapEquiv_SnapArrayBufferInfo
               (SnapObject *sobj1,SnapObject *sobj2,TTDCompareMap *compareMap)

{
  uint *puVar1;
  uint *puVar2;
  bool bVar3;
  ulong uVar4;
  TTD_PTR_ID local_38;
  
  if ((sobj1->SnapObjectTag == SnapArrayBufferObject) &&
     (sobj2->SnapObjectTag == SnapArrayBufferObject)) {
    puVar1 = (uint *)sobj1->AddtlSnapObjectInfo;
    puVar2 = (uint *)sobj2->AddtlSnapObjectInfo;
    TTDCompareMap::DiagnosticAssert(compareMap,*puVar1 == *puVar2);
    local_38 = sobj1->ObjectPtrId;
    bVar3 = JsUtil::
            BaseDictionary<unsigned_long,_unsigned_long,_Memory::HeapAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
            ::ContainsKey(&(compareMap->H1PendingAsyncModBufferSet).
                           super_BaseDictionary<unsigned_long,_unsigned_long,_Memory::HeapAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
                          ,&local_38);
    if (!bVar3) {
      local_38 = sobj2->ObjectPtrId;
      bVar3 = JsUtil::
              BaseDictionary<unsigned_long,_unsigned_long,_Memory::HeapAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
              ::ContainsKey(&(compareMap->H2PendingAsyncModBufferSet).
                             super_BaseDictionary<unsigned_long,_unsigned_long,_Memory::HeapAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
                            ,&local_38);
      if (!bVar3) {
        if (*puVar1 == 0) {
          return;
        }
        uVar4 = 0;
        do {
          TTDCompareMap::DiagnosticAssert
                    (compareMap,
                     *(char *)(*(long *)(puVar1 + 2) + uVar4) ==
                     *(char *)(*(long *)(puVar2 + 2) + uVar4));
          uVar4 = uVar4 + 1;
        } while (uVar4 < *puVar1);
        return;
      }
    }
    local_38 = sobj1->ObjectPtrId;
    bVar3 = JsUtil::
            BaseDictionary<unsigned_long,_unsigned_long,_Memory::HeapAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
            ::ContainsKey(&(compareMap->H1PendingAsyncModBufferSet).
                           super_BaseDictionary<unsigned_long,_unsigned_long,_Memory::HeapAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
                          ,&local_38);
    if (bVar3) {
      local_38 = sobj2->ObjectPtrId;
      bVar3 = JsUtil::
              BaseDictionary<unsigned_long,_unsigned_long,_Memory::HeapAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
              ::ContainsKey(&(compareMap->H2PendingAsyncModBufferSet).
                             super_BaseDictionary<unsigned_long,_unsigned_long,_Memory::HeapAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
                            ,&local_38);
    }
    else {
      bVar3 = false;
    }
    TTDCompareMap::DiagnosticAssert(compareMap,bVar3);
    return;
  }
  TTDAbort_unrecoverable_error("Tag does not match.");
}

Assistant:

void AssertSnapEquiv_SnapArrayBufferInfo(const SnapObject* sobj1, const SnapObject* sobj2, TTDCompareMap& compareMap)
        {
            const SnapArrayBufferInfo* buffInfo1 = SnapObjectGetAddtlInfoAs<SnapArrayBufferInfo*, SnapObjectType::SnapArrayBufferObject>(sobj1);
            const SnapArrayBufferInfo* buffInfo2 = SnapObjectGetAddtlInfoAs<SnapArrayBufferInfo*, SnapObjectType::SnapArrayBufferObject>(sobj2);

            compareMap.DiagnosticAssert(buffInfo1->Length == buffInfo2->Length);

            //
            //Pending buffers cannot be accessed by the program until they are off the pending lists.
            //So we do not force the updates in closer sync than this and they may not be updated in sync so (as long as they are pending) in both.
            //
            if(compareMap.H1PendingAsyncModBufferSet.Contains(sobj1->ObjectPtrId) || compareMap.H2PendingAsyncModBufferSet.Contains(sobj2->ObjectPtrId))
            {
                compareMap.DiagnosticAssert(compareMap.H1PendingAsyncModBufferSet.Contains(sobj1->ObjectPtrId) && compareMap.H2PendingAsyncModBufferSet.Contains(sobj2->ObjectPtrId));
            }
            else
            {
                for(uint32 i = 0; i < buffInfo1->Length; ++i)
                {
                    compareMap.DiagnosticAssert(buffInfo1->Buff[i] == buffInfo2->Buff[i]);
                }
            }
        }